

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag)

{
  bool bVar1;
  cmMakefile *this_00;
  allocator local_41;
  
  if (flag != (char *)0x0) {
    AddDefineFlag(this,flag,&this->DefineFlagsOrig);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,flag,&local_41);
    bVar1 = ParseDefineFlag(this,(string *)&stack0xffffffffffffffc0,false);
    this_00 = (cmMakefile *)&stack0xffffffffffffffc0;
    std::__cxx11::string::~string((string *)this_00);
    if (!bVar1) {
      AddDefineFlag(this_00,flag,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag)
{
  if (!flag) {
    return;
  }

  // Update the string used for the old DEFINITIONS property.
  this->AddDefineFlag(flag, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if (this->ParseDefineFlag(flag, false)) {
    return;
  }

  // Add this flag that does not look like a definition.
  this->AddDefineFlag(flag, this->DefineFlags);
}